

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetector::markCheckingPeriodLeaksAsNonCheckingPeriod(MemoryLeakDetector *this)

{
  MemoryLeakDetectorNode *pMVar1;
  MemoryLeakDetectorTable *in_RDI;
  MemoryLeakDetectorNode *unaff_retaddr;
  MemoryLeakDetectorNode *leak;
  undefined8 in_stack_fffffffffffffff0;
  
  pMVar1 = MemoryLeakDetectorTable::getFirstLeak
                     (in_RDI,(MemLeakPeriod)((ulong)in_stack_fffffffffffffff0 >> 0x20));
  while (pMVar1 != (MemoryLeakDetectorNode *)0x0) {
    if (*(int *)(pMVar1 + 0x30) == 3) {
      *(undefined4 *)(pMVar1 + 0x30) = 2;
    }
    pMVar1 = MemoryLeakDetectorTable::getNextLeak
                       ((MemoryLeakDetectorTable *)leak,unaff_retaddr,
                        (MemLeakPeriod)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void MemoryLeakDetector::markCheckingPeriodLeaksAsNonCheckingPeriod()
{
    MemoryLeakDetectorNode* leak = memoryTable_.getFirstLeak(mem_leak_period_checking);
    while (leak) {
        if (leak->period_ == mem_leak_period_checking) leak->period_ = mem_leak_period_enabled;
        leak = memoryTable_.getNextLeak(leak, mem_leak_period_checking);
    }
}